

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O1

int __thiscall QButtonGroup::id(QButtonGroup *this,QAbstractButton *button)

{
  Data<QHashPrivate::Node<QAbstractButton*,int>> *this_00;
  int iVar1;
  Node<QAbstractButton_*,_int> *pNVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QAbstractButton *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(Data<QHashPrivate::Node<QAbstractButton*,int>> **)(*(long *)&this->field_0x8 + 0xa8);
  local_10 = button;
  if (this_00 != (Data<QHashPrivate::Node<QAbstractButton*,int>> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QAbstractButton*,int>>::
             findNode<QAbstractButton*>(this_00,&local_10);
    if (pNVar2 != (Node<QAbstractButton_*,_int> *)0x0) {
      piVar3 = &pNVar2->value;
      goto LAB_003ca632;
    }
  }
  piVar3 = (int *)0x0;
LAB_003ca632:
  if (piVar3 == (int *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = *piVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QButtonGroup::id(QAbstractButton *button) const
{
    Q_D(const QButtonGroup);
    return d->mapping.value(button, -1);
}